

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

shared_ptr<soplex::Tolerances> __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
::tolerances(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<soplex::Tolerances> *in_RSI;
  element_type *in_RDI;
  shared_ptr<soplex::Tolerances> sVar1;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr(in_RSI,(shared_ptr<soplex::Tolerances> *)in_RDI);
  sVar1.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<soplex::Tolerances>)
         sVar1.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

const std::shared_ptr<Tolerances> tolerances() const
   {
      return _tolerances;
   }